

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_array_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv)

{
  int iVar1;
  undefined8 in_RAX;
  JSValueUnion JVar2;
  ulong uVar3;
  ulong uVar4;
  JSValueUnion JVar5;
  int64_t iVar6;
  int64_t *piVar7;
  JSValue this_obj;
  JSValue JVar8;
  JSValue val;
  JSValue val_00;
  JSValue val_01;
  uint32_t len;
  
  len = (uint32_t)((ulong)in_RAX >> 0x20);
  this_obj = js_create_from_ctor(ctx,new_target,2);
  if ((int)this_obj.tag == 6) {
LAB_0012bc39:
    uVar3 = (ulong)this_obj.u.ptr & 0xffffffff00000000;
    goto LAB_0012bd0d;
  }
  if (argc == 1) {
    iVar1 = (int)argv->tag;
    if ((iVar1 != 7) && (iVar1 != 0)) goto LAB_0012bcb4;
    val.tag = argv->tag;
    val.u.ptr = (argv->u).ptr;
    iVar1 = JS_ToArrayLengthFree(ctx,&len,val,1);
    if (iVar1 == 0) {
      JVar2 = (JSValueUnion)(long)(int)len;
      JVar5.float64 = (double)len;
      if (-1 < (long)JVar2.ptr) {
        JVar5 = JVar2;
      }
      iVar6 = 7;
      if (-1 < (long)JVar2.ptr) {
        iVar6 = 0;
      }
      val_00.tag = iVar6;
      val_00.u.float64 = JVar5.float64;
      iVar1 = JS_SetProperty(ctx,this_obj,0x30,val_00);
      if (-1 < iVar1) goto LAB_0012bc39;
    }
  }
  else {
LAB_0012bcb4:
    uVar4 = 0;
    uVar3 = (ulong)(uint)argc;
    if (argc < 1) {
      uVar3 = uVar4;
    }
    piVar7 = &argv->tag;
    do {
      if (uVar3 == uVar4) goto LAB_0012bc39;
      JVar5 = (JSValueUnion)((JSValueUnion *)(piVar7 + -1))->ptr;
      iVar6 = *piVar7;
      if (0xfffffff4 < (uint)iVar6) {
        *(int *)JVar5.ptr = *JVar5.ptr + 1;
      }
      val_01.tag = iVar6;
      val_01.u.ptr = JVar5.ptr;
      iVar1 = JS_SetPropertyUint32(ctx,this_obj,(uint32_t)uVar4,val_01);
      uVar4 = uVar4 + 1;
      piVar7 = piVar7 + 2;
    } while (-1 < iVar1);
  }
  JS_FreeValue(ctx,this_obj);
  this_obj = (JSValue)(ZEXT816(6) << 0x40);
  uVar3 = 0;
LAB_0012bd0d:
  JVar8.u.ptr = (void *)((ulong)this_obj.u.ptr & 0xffffffff | uVar3);
  JVar8.tag = this_obj.tag;
  return JVar8;
}

Assistant:

static JSValue js_array_constructor(JSContext *ctx, JSValueConst new_target,
                                    int argc, JSValueConst *argv)
{
    JSValue obj;
    int i;

    obj = js_create_from_ctor(ctx, new_target, JS_CLASS_ARRAY);
    if (JS_IsException(obj))
        return obj;
    if (argc == 1 && JS_IsNumber(argv[0])) {
        uint32_t len;
        if (JS_ToArrayLengthFree(ctx, &len, JS_DupValue(ctx, argv[0]), TRUE))
            goto fail;
        if (JS_SetProperty(ctx, obj, JS_ATOM_length, JS_NewUint32(ctx, len)) < 0)
            goto fail;
    } else {
        for(i = 0; i < argc; i++) {
            if (JS_SetPropertyUint32(ctx, obj, i, JS_DupValue(ctx, argv[i])) < 0)
                goto fail;
        }
    }
    return obj;
fail:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}